

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionhandler.c
# Opt level: O3

OPTIONHANDLER_HANDLE OptionHandler_Clone(OPTIONHANDLER_HANDLE handler)

{
  OPTIONHANDLER_RESULT OVar1;
  OPTIONHANDLER_HANDLE handle;
  size_t sVar2;
  undefined8 *puVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  char *pcVar6;
  size_t index;
  
  if (handler == (OPTIONHANDLER_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      pcVar6 = "NULL argument: handler";
      iVar5 = 0x9b;
LAB_001120b8:
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/optionhandler.c"
                ,"OptionHandler_Clone",iVar5,1,pcVar6);
      return (OPTIONHANDLER_HANDLE)0x0;
    }
  }
  else {
    handle = CreateInternal(handler->cloneOption,handler->destroyOption,handler->setOption);
    if (handle == (OPTIONHANDLER_HANDLE)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar6 = "unable to create option handler";
        iVar5 = 0xa7;
        goto LAB_001120b8;
      }
    }
    else {
      sVar2 = VECTOR_size(handler->storage);
      if (sVar2 == 0) {
        return handle;
      }
      index = 0;
      while ((puVar3 = (undefined8 *)VECTOR_element(handler->storage,index),
             puVar3 == (undefined8 *)0x0 ||
             (OVar1 = AddOptionInternal(handle,(char *)*puVar3,(void *)puVar3[1]),
             OVar1 == OPTIONHANDLER_OK))) {
        index = index + 1;
        if (sVar2 == index) {
          return handle;
        }
      }
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/optionhandler.c"
                  ,"OptionHandler_Clone",0xba,1,"Error cloning option %s",*puVar3);
      }
      DestroyInternal(handle);
    }
  }
  return (OPTIONHANDLER_HANDLE)0x0;
}

Assistant:

OPTIONHANDLER_HANDLE OptionHandler_Clone(OPTIONHANDLER_HANDLE handler)
{
    OPTIONHANDLER_HANDLE_DATA* result;

    if (handler == NULL)
    {
        /* Codes_SRS_OPTIONHANDLER_01_010: [ If handler is NULL, OptionHandler_Clone shall fail and return NULL. ]*/
        LogError("NULL argument: handler");
        result = NULL;
    }
    else
    {
        /* Codes_SRS_OPTIONHANDLER_01_001: [ OptionHandler_Clone shall clone an existing option handler instance. ]*/
        /* Codes_SRS_OPTIONHANDLER_01_002: [ On success it shall return a non-NULL handle. ]*/
        /* Codes_SRS_OPTIONHANDLER_01_003: [ OptionHandler_Clone shall allocate memory for the new option handler instance. ]*/
        result = CreateInternal(handler->cloneOption, handler->destroyOption, handler->setOption);
        if (result == NULL)
        {
            /* Codes_SRS_OPTIONHANDLER_01_004: [ If allocating memory fails, OptionHandler_Clone shall return NULL. ]*/
            LogError("unable to create option handler");
        }
        else
        {
            /* Codes_SRS_OPTIONHANDLER_01_005: [ OptionHandler_Clone shall iterate through all the options stored by the option handler to be cloned by using VECTOR's iteration mechanism. ]*/
            size_t option_count = VECTOR_size(handler->storage);
            size_t i;

            for (i = 0; i < option_count; i++)
            {
                OPTION* option = (OPTION*)VECTOR_element(handler->storage, i);
                if (option != NULL)
                {
                    /* Codes_SRS_OPTIONHANDLER_01_006: [ For each option the option name shall be cloned by calling mallocAndStrcpy_s. ]*/
                    /* Codes_SRS_OPTIONHANDLER_01_007: [ For each option the value shall be cloned by using the cloning function associated with the source option handler handler. ]*/
                    if (AddOptionInternal(result, option->name, option->storage) != OPTIONHANDLER_OK)
                    {
                        /* Codes_SRS_OPTIONHANDLER_01_008: [ If cloning one of the option names fails, OptionHandler_Clone shall return NULL. ]*/
                        /* Codes_SRS_OPTIONHANDLER_01_009: [ If cloning one of the option values fails, OptionHandler_Clone shall return NULL. ]*/
                        LogError("Error cloning option %s", option->name);
                        break;
                    }
                }
            }

            if (i < option_count)
            {
                DestroyInternal(result);
                result = NULL;
            }
        }
    }

    return result;
}